

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::operator=
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *other)

{
  if (this != other) {
    move_assignment(this,other);
  }
  return this;
}

Assistant:

basic_json& operator=(basic_json&& other) noexcept
        {
            if (this != &other)
            {
                move_assignment(std::move(other));
            }
            return *this;
        }